

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

double __thiscall tetgenmesh::tetaspectratio(tetgenmesh *this,point pa,point pb,point pc,point pd)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  tetgenmesh *this_00;
  double (*padVar4) [3];
  double dVar5;
  double dVar6;
  double dVar7;
  int indx [4];
  double rhs [4];
  double D;
  double H [4];
  double A [4] [4];
  double N [4] [3];
  double edgelength [6];
  double V [6] [3];
  
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    V[0][lVar1] = pa[lVar1] - pd[lVar1];
  }
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    V[1][lVar1] = pb[lVar1] - pd[lVar1];
  }
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    V[2][lVar1] = pc[lVar1] - pd[lVar1];
  }
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    V[3][lVar1] = pb[lVar1] - pa[lVar1];
  }
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    V[4][lVar1] = pc[lVar1] - pb[lVar1];
  }
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    V[5][lVar1] = pa[lVar1] - pc[lVar1];
  }
  pdVar3 = V[0] + 2;
  for (this_00 = (tetgenmesh *)0x0; this_00 != (tetgenmesh *)0x6;
      this_00 = (tetgenmesh *)((long)&this_00->in + 1)) {
    edgelength[(long)this_00] =
         *pdVar3 * *pdVar3 +
         (*(double (*) [3])(pdVar3 + -2))[0] * (*(double (*) [3])(pdVar3 + -2))[0] +
         pdVar3[-1] * pdVar3[-1];
    pdVar3 = pdVar3 + 3;
  }
  dVar6 = edgelength[0];
  for (lVar1 = 1; lVar1 != 6; lVar1 = lVar1 + 1) {
    dVar5 = edgelength[lVar1];
    if (edgelength[lVar1] <= dVar6) {
      dVar5 = dVar6;
    }
    dVar6 = dVar5;
  }
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    A[0][lVar1] = pa[lVar1] - pd[lVar1];
  }
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    A[1][lVar1] = pb[lVar1] - pd[lVar1];
  }
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    A[2][lVar1] = pc[lVar1] - pd[lVar1];
  }
  lu_decmp((tetgenmesh *)0x6,A,3,indx,&D,0);
  dVar5 = (A[indx[0]][0] * A[indx[1]][1] * A[indx[2]][2]) / 6.0;
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    padVar4 = N;
    for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
      for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
        rhs[lVar2] = 0.0;
      }
      rhs[lVar1] = 1.0;
      lu_solve(this_00,A,3,indx,rhs,0);
      for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
        (*padVar4)[lVar2] = rhs[lVar2];
      }
      padVar4 = padVar4 + 1;
    }
    for (lVar1 = -0x18; lVar1 != 0; lVar1 = lVar1 + 8) {
      *(double *)((long)edgelength + lVar1) =
           (-*(double *)((long)N[1] + lVar1) - *(double *)((long)N[2] + lVar1)) -
           *(double *)((long)N[3] + lVar1);
    }
    pdVar3 = N[0] + 2;
    for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
      H[lVar1] = SQRT(*pdVar3 * *pdVar3 +
                      (*(double (*) [3])(pdVar3 + -2))[0] * (*(double (*) [3])(pdVar3 + -2))[0] +
                      pdVar3[-1] * pdVar3[-1]);
      pdVar3 = pdVar3 + 3;
    }
    dVar5 = H[0];
    for (lVar1 = 1; lVar1 != 4; lVar1 = lVar1 + 1) {
      dVar7 = H[lVar1];
      if (H[lVar1] <= dVar5) {
        dVar7 = dVar5;
      }
      dVar5 = dVar7;
    }
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    dVar5 = dVar5 * dVar6;
  }
  else {
    dVar5 = 1e+200;
  }
  return dVar5;
}

Assistant:

REAL tetgenmesh::tetaspectratio(point pa, point pb, point pc, point pd)
{
  REAL V[6][3], edgelength[6], longlen;
  REAL vda[3], vdb[3], vdc[3];
  REAL N[4][3], A[4][4], rhs[4], D;
  REAL H[4], volume, minheightinv;
  int indx[4];
  int i, j; 

  // Set the edge vectors: V[0], ..., V[5]
  for (i = 0; i < 3; i++) V[0][i] = pa[i] - pd[i]; 
  for (i = 0; i < 3; i++) V[1][i] = pb[i] - pd[i]; 
  for (i = 0; i < 3; i++) V[2][i] = pc[i] - pd[i]; 
  for (i = 0; i < 3; i++) V[3][i] = pb[i] - pa[i]; 
  for (i = 0; i < 3; i++) V[4][i] = pc[i] - pb[i]; 
  for (i = 0; i < 3; i++) V[5][i] = pa[i] - pc[i]; 

  // Get the squares of the edge lengths.
  for (i = 0; i < 6; i++) edgelength[i] = dot(V[i], V[i]);

  // Calculate the longest and shortest edge length.
  longlen = edgelength[0];
  for (i = 1; i < 6; i++) {
    longlen  = edgelength[i] > longlen ? edgelength[i] : longlen;
  }

  // Set the matrix A = [vda, vdb, vdc]^T.
  for (i = 0; i < 3; i++) A[0][i] = vda[i] = pa[i] - pd[i];
  for (i = 0; i < 3; i++) A[1][i] = vdb[i] = pb[i] - pd[i];
  for (i = 0; i < 3; i++) A[2][i] = vdc[i] = pc[i] - pd[i];
  // Lu-decompose the matrix A.
  lu_decmp(A, 3, indx, &D, 0);
  // Get the volume of abcd.
  volume = (A[indx[0]][0] * A[indx[1]][1] * A[indx[2]][2]) / 6.0;
  // Check if it is zero.
  if (volume == 0.0) return 1.0e+200; // A degenerate tet.

  // Compute the 4 face normals (N[0], ..., N[3]).
  for (j = 0; j < 3; j++) {
    for (i = 0; i < 3; i++) rhs[i] = 0.0;
    rhs[j] = 1.0;  // Positive means the inside direction
    lu_solve(A, 3, indx, rhs, 0);
    for (i = 0; i < 3; i++) N[j][i] = rhs[i];
  }
  // Get the fourth normal by summing up the first three.
  for (i = 0; i < 3; i++) N[3][i] = - N[0][i] - N[1][i] - N[2][i];
  // Normalized the normals.
  for (i = 0; i < 4; i++) {
    // H[i] is the inverse of the height of its corresponding face.
    H[i] = sqrt(dot(N[i], N[i]));
    // if (H[i] > 0.0) {
    //   for (j = 0; j < 3; j++) N[i][j] /= H[i];
    // }
  }
  // Get the radius of the inscribed sphere.
  // insradius = 1.0 / (H[0] + H[1] + H[2] + H[3]);
  // Get the biggest H[i] (corresponding to the smallest height).
  minheightinv = H[0];
  for (i = 1; i < 4; i++) {
    if (H[i] > minheightinv) minheightinv = H[i];
  }

  return sqrt(longlen) * minheightinv;
}